

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::InitOutputPathPrefix(cmGlobalNinjaGenerator *this)

{
  cmMakefile *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_NINJA_OUTPUT_PATH_PREFIX",&local_39);
  cmMakefile::GetSafeDefinition(this_00,&local_38);
  std::__cxx11::string::_M_assign((string *)&this->OutputPathPrefix);
  std::__cxx11::string::~string((string *)&local_38);
  EnsureTrailingSlash(&this->OutputPathPrefix);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::InitOutputPathPrefix()
{
  this->OutputPathPrefix =
    this->LocalGenerators[0]->GetMakefile()->GetSafeDefinition(
      "CMAKE_NINJA_OUTPUT_PATH_PREFIX");
  EnsureTrailingSlash(this->OutputPathPrefix);
}